

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  pointer pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  string *psVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  string msg_1;
  string currentStart;
  string currentStartFile;
  string msg;
  string local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  string local_1b8;
  undefined1 local_198 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_188 [2];
  ios_base local_128 [264];
  
  InitializeFromParent(mf,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_198,&mf->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_198);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + psVar4->_M_string_length);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"   Entering             ","");
    std::__cxx11::string::_M_append(local_198,(ulong)local_1d8);
    cmSystemTools::Message((string *)local_198,(char *)0x0);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_198._0_8_ != local_188)
    {
      operator_delete((void *)local_198._0_8_,
                      (ulong)((long)local_188[0].Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_1d8,(long)local_1d8 + local_1d0);
  std::__cxx11::string::append((char *)&local_1b8);
  bVar2 = cmsys::SystemTools::FileExists(&local_1b8,true);
  if (bVar2) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"   Returning to         ","");
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_198,&this->StateSnapshot);
      psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_198);
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)(psVar4->_M_dataplus)._M_p);
      cmSystemTools::Message(&local_1f8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_001cc03d;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"The source directory\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"does not contain a CMakeLists.txt file.",0x27);
  PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014,false);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1f8,(cmPolicies *)0xe,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
LAB_001cbfe7:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
LAB_001cc012:
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar3 == WARN) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"CMake does not support this case but it used ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"to work accidentally and is being allowed for ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"compatibility.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f8,(cmPolicies *)0xe,id_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    IssueMessage(this,AUTHOR_WARNING,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_001cc012;
  }
  else if (PVar3 == NEW) goto LAB_001cbfe7;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
LAB_001cc03d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = "   Entering             ";
    msg += currentStart;
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = "   Returning to         ";
    msg += this->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg);
  }
}